

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_moves(m68k_info *info,int size)

{
  uint uVar1;
  cs_m68k *op;
  
  op = build_init_op(info,0x11f,2,size);
  uVar1 = read_imm_16(info);
  if ((uVar1 >> 0xb & 1) == 0) {
    get_ea_mode_op(info,op->operands,info->ir,size);
    op->operands[1].field_0.reg = (uVar1 >> 0xc & 7) + (uint)(0x7fff < uVar1) * 8 + M68K_REG_D0;
    return;
  }
  op->operands[0].field_0.reg = (uVar1 >> 0xc & 7) + (uint)(0x7fff < uVar1) * 8 + M68K_REG_D0;
  get_ea_mode_op(info,op->operands + 1,info->ir,size);
  return;
}

Assistant:

static void build_moves(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVES, 2, size);
	uint extension = read_imm_16(info);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	if (BIT_B(extension)) {
		op0->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
		get_ea_mode_op(info, op1, info->ir, size);
	} else {
		get_ea_mode_op(info, op0, info->ir, size);
		op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
	}
}